

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionModelBullet::SyncPosition(ChCollisionModelBullet *this)

{
  undefined8 uVar1;
  cbtCollisionObject *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChCoordsys<double> mcsys;
  undefined1 local_98 [16];
  double local_88;
  ChQuaternion<double> local_80;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_40 [16];
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  
  (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xb])(local_98);
  auVar3 = vcvtpd2ps_avx(local_98);
  pcVar2 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(pcVar2->m_worldTransform).m_origin.m_floats = uVar1;
  (pcVar2->m_worldTransform).m_origin.m_floats[2] = (float)local_88;
  (pcVar2->m_worldTransform).m_origin.m_floats[3] = 0.0;
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)local_58,&local_80);
  auVar3 = vcvtpd2ps_avx(local_58);
  auVar4 = vcvtpd2ps_avx(local_40);
  auVar5 = vcvtpd2ps_avx(local_28);
  pcVar2 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2] = (float)local_48;
  (pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
  uVar1 = vmovlps_avx(auVar4);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2] = (float)local_30;
  (pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2] = (float)local_18;
  (pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
  return;
}

Assistant:

void ChCollisionModelBullet::SyncPosition() {
    ChCoordsys<> mcsys = mcontactable->GetCsysForCollisionModel();

    bt_collision_object->getWorldTransform().setOrigin(
        cbtVector3((cbtScalar)mcsys.pos.x(), (cbtScalar)mcsys.pos.y(), (cbtScalar)mcsys.pos.z()));
    const ChMatrix33<>& rA(mcsys.rot);
    cbtMatrix3x3 basisA((cbtScalar)rA(0, 0), (cbtScalar)rA(0, 1), (cbtScalar)rA(0, 2), (cbtScalar)rA(1, 0),
                        (cbtScalar)rA(1, 1), (cbtScalar)rA(1, 2), (cbtScalar)rA(2, 0), (cbtScalar)rA(2, 1),
                        (cbtScalar)rA(2, 2));
    bt_collision_object->getWorldTransform().setBasis(basisA);
}